

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void e2e_robust_test(void)

{
  time_t tVar1;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  fdb_config fconfig;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined8 uStackY_338;
  fdb_config in_stack_fffffffffffffcd0;
  undefined1 local_148 [16];
  undefined8 local_138;
  undefined4 local_12c;
  undefined1 local_128;
  undefined1 local_127;
  undefined4 local_124;
  undefined1 local_11a;
  __time_t local_30;
  __suseconds_t local_28;
  timeval local_10;
  
  bVar5 = 0;
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_30 = local_10.tv_sec;
  local_28 = local_10.tv_usec;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  fdb_get_default_config();
  local_138 = 0x400;
  local_124 = 1;
  local_11a = 1;
  local_127 = 2;
  local_128 = 1;
  local_12c = 0x50;
  memcpy(&stack0xfffffffffffffdc0,local_148,0xf8);
  puVar3 = (undefined8 *)&stack0xfffffffffffffdc0;
  puVar4 = &uStackY_338;
  for (lVar2 = 0x1f; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  e2e_robust_pattern(in_stack_fffffffffffffcd0);
  if (e2e_robust_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","TEST: e2e robust test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","TEST: e2e robust test");
  }
  return;
}

Assistant:

void e2e_robust_test() {
    TEST_INIT();

    randomize();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_mode=FDB_COMPACTION_AUTO;
    fconfig.durability_opt = FDB_DRB_ASYNC;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    // to allow iterators to validate docs across async compaction
    // specify purging_interval so deleted docs are not dropped by
    // compactor immediately..
    fconfig.purging_interval = 80;

    // test
    e2e_robust_pattern(fconfig);

    TEST_RESULT("TEST: e2e robust test");
}